

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::setHtml(QTextDocument *this,QString *html)

{
  long lVar1;
  undefined1 uVar2;
  QTextDocumentPrivate *this_00;
  QTextHtmlImporter *in_RSI;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  bool previousState;
  QTextDocumentPrivate *d;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 uVar3;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 local_100 [8];
  QTextDocumentPrivate *in_stack_ffffffffffffff08;
  ImportMode in_stack_ffffffffffffff14;
  QString *in_stack_ffffffffffffff18;
  QTextDocument *in_stack_ffffffffffffff20;
  QTextHtmlImporter *in_stack_ffffffffffffff28;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextDocument *)0x7ac835);
  uVar2 = QTextDocumentPrivate::isUndoRedoEnabled(this_00);
  QTextDocumentPrivate::enableUndoRedo
            ((QTextDocumentPrivate *)CONCAT17(uVar2,in_stack_fffffffffffffee0),(bool)uVar3);
  QTextDocumentPrivate::beginEditBlock(this_00);
  QTextDocumentPrivate::clear(in_stack_ffffffffffffff08);
  uVar3 = (undefined1)((ulong)local_100 >> 0x38);
  QTextHtmlImporter::QTextHtmlImporter
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff14,(QTextDocument *)in_stack_ffffffffffffff08);
  QTextHtmlImporter::import(in_RSI);
  QTextHtmlImporter::~QTextHtmlImporter((QTextHtmlImporter *)in_RDI);
  QTextDocumentPrivate::endEditBlock(in_RDI);
  QTextDocumentPrivate::enableUndoRedo
            ((QTextDocumentPrivate *)CONCAT17(uVar2,in_stack_fffffffffffffee0),(bool)uVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setHtml(const QString &html)
{
    Q_D(QTextDocument);
    bool previousState = d->isUndoRedoEnabled();
    d->enableUndoRedo(false);
    d->beginEditBlock();
    d->clear();
    // ctor calls parse() to build up QTextHtmlParser::nodes list
    // then import() populates the QTextDocument from those
    QTextHtmlImporter(this, html, QTextHtmlImporter::ImportToDocument).import();
    d->endEditBlock();
    d->enableUndoRedo(previousState);
}